

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recognition.cpp
# Opt level: O2

int __thiscall
TUPU::Recognition::performWithPath
          (Recognition *this,string *secretId,string *result,long *statusCode,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *images,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *tags,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sequenceIds)

{
  long lVar1;
  element_type *peVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  shared_ptr<TUPU::TImage> image;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> imgList;
  allocator local_a9;
  char *local_a8;
  value_type local_a0;
  Recognition *local_90;
  string *local_88;
  string *local_80;
  long *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> local_68;
  string local_50 [32];
  
  local_68.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (char *)0x0;
  pcVar4 = (char *)0x0;
  local_90 = this;
  local_88 = secretId;
  local_80 = result;
  local_78 = statusCode;
  local_70 = tags;
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)(*(long *)(images + 8) - *(long *)images >> 5); uVar5 = uVar5 + 1) {
    std::make_shared<TUPU::TImage>();
    lVar7 = uVar6 * 0x20;
    TImage::setPath(local_a0.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (string *)(*(long *)images + lVar7));
    peVar2 = local_a0.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar1 = *(long *)local_70;
    if ((uVar6 < (ulong)(*(long *)(local_70 + 8) - lVar1 >> 5)) &&
       (*(long *)(lVar1 + 8 + lVar7) != 0)) {
      local_a8 = *(char **)(lVar1 + lVar7);
    }
    if (local_a8 != (char *)0x0) {
      std::__cxx11::string::string(local_50,local_a8,&local_a9);
      std::__cxx11::string::_M_assign((string *)&peVar2->m_tag);
      std::__cxx11::string::~string(local_50);
    }
    peVar2 = local_a0.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar1 = *(long *)sequenceIds;
    if ((uVar6 < (ulong)(*(long *)(sequenceIds + 8) - lVar1 >> 5)) &&
       (*(long *)(lVar1 + 8 + lVar7) != 0)) {
      pcVar4 = *(char **)(lVar1 + lVar7);
    }
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string(local_50,pcVar4,&local_a9);
      std::__cxx11::string::_M_assign((string *)&peVar2->m_sequenceId);
      std::__cxx11::string::~string(local_50);
    }
    std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
    push_back(&local_68,&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  iVar3 = perform(local_90,local_88,&local_68,local_80,local_78);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  ~vector(&local_68);
  return iVar3;
}

Assistant:

int Recognition::performWithPath(const string & secretId, string & result, long *statusCode,
    const vector<string> & images, const vector<string> & tags,
    const std::vector<std::string> & sequenceIds)
{
    vector<shared_ptr<TImage>> imgList;

    unsigned int i = 0;
    const char * tag = NULL;
    const char * sequenceId = NULL;
    while (i < images.size())
    {
        shared_ptr<TImage> image = std::make_shared<TImage>();
        image->setPath(images[i]);

        if (i < tags.size() && !tags[i].empty())
            tag = tags[i].c_str();
        if (tag)
            image->setTag(tag);

        if (i < sequenceIds.size() && !sequenceIds[i].empty())
            sequenceId = sequenceIds[i].c_str();
        if (sequenceId)
            image->setSequenceId(sequenceId);

        imgList.push_back(image);

        i++;
    }

    return perform(secretId, imgList, result, statusCode);
}